

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratiotest.cpp
# Opt level: O0

double step(double x,double p,double l,double u,double t)

{
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  
  if ((in_XMM1_Qa < -in_XMM4_Qa) &&
     (dVar1 = std::numeric_limits<double>::infinity(), -dVar1 < in_XMM2_Qa)) {
    return (in_XMM2_Qa - in_XMM0_Qa) / in_XMM1_Qa;
  }
  if ((in_XMM4_Qa < in_XMM1_Qa) &&
     (dVar1 = std::numeric_limits<double>::infinity(), in_XMM3_Qa < dVar1)) {
    return (in_XMM3_Qa - in_XMM0_Qa) / in_XMM1_Qa;
  }
  dVar1 = std::numeric_limits<double>::infinity();
  return dVar1;
}

Assistant:

static double step(double x, double p, double l, double u, double t) {
  if (p < -t && l > -std::numeric_limits<double>::infinity()) {
    return (l - x) / p;
  } else if (p > t && u < std::numeric_limits<double>::infinity()) {
    return (u - x) / p;
  } else {
    return std::numeric_limits<double>::infinity();
  }
}